

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

int libtorrent::path_compare(string_view lhs,string_view lfile,string_view rhs,string_view rfile)

{
  uint uVar1;
  char *pcVar2;
  size_t __n;
  ulong uVar3;
  difference_type __diff;
  ulong uVar4;
  long lVar5;
  string_view p;
  string_view p_00;
  string_view p_01;
  string_view p_02;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a8;
  char *local_80;
  size_t local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  p._M_str = lfile._M_str;
  local_78 = lfile._M_len;
  p._M_len = (size_t)lhs._M_str;
  pcVar2 = p._M_str;
  lsplit_path(&local_a8,(libtorrent *)lhs._M_len,p);
  p_00._M_str = pcVar2;
  p_00._M_len = (size_t)rhs._M_str;
  lsplit_path(&local_c8,(libtorrent *)rhs._M_len,p_00);
  pcVar2 = (char *)CONCAT71((int7)((ulong)pcVar2 >> 8),local_a8.first._M_len == 0);
  uVar3 = 0;
  if (local_c8.first._M_len != 0 || local_a8.first._M_len != 0) {
    local_80 = p._M_str;
    do {
      if ((char)pcVar2 != '\0') {
        local_a8.first._M_len = local_78;
        local_a8.first._M_str = local_80;
LAB_0023f1e7:
        if (local_c8.first._M_len == 0) {
          local_c8.first._M_len = rfile._M_len;
          local_c8.first._M_str = rfile._M_str;
        }
        uVar4 = local_a8.first._M_len - local_c8.first._M_len;
        __n = local_c8.first._M_len;
        if (local_a8.first._M_len < local_c8.first._M_len) {
          __n = local_a8.first._M_len;
        }
        if (__n == 0) {
          uVar3 = 0;
        }
        else {
          uVar1 = memcmp(local_a8.first._M_str,local_c8.first._M_str,__n);
          uVar3 = (ulong)uVar1;
        }
        if ((int)uVar3 == 0) {
          uVar3 = 0xffffffff80000000;
          if (-0x80000000 < (long)uVar4) {
            uVar3 = uVar4;
          }
          if (0x7ffffffe < (long)uVar3) {
            uVar3 = 0x7fffffff;
          }
        }
        break;
      }
      if (local_c8.first._M_len == 0) goto LAB_0023f1e7;
      lVar5 = local_a8.first._M_len - local_c8.first._M_len;
      if (local_a8.first._M_len < local_c8.first._M_len) {
        local_c8.first._M_len = local_a8.first._M_len;
      }
      uVar1 = memcmp(local_a8.first._M_str,local_c8.first._M_str,local_c8.first._M_len);
      if (uVar1 == 0) {
        if (lVar5 < -0x7fffffff) {
          lVar5 = -0x80000000;
        }
        if (0x7ffffffe < lVar5) {
          lVar5 = 0x7fffffff;
        }
        uVar1 = (uint)lVar5;
      }
      if (uVar1 != 0) {
        uVar3 = (ulong)uVar1;
        break;
      }
      p_01._M_str = pcVar2;
      p_01._M_len = (size_t)local_a8.second._M_str;
      lsplit_path(&local_50,(libtorrent *)local_a8.second._M_len,p_01);
      local_a8.first._M_len = local_50.first._M_len;
      local_a8.first._M_str = local_50.first._M_str;
      local_a8.second._M_len = local_50.second._M_len;
      local_a8.second._M_str = local_50.second._M_str;
      p_02._M_str = pcVar2;
      p_02._M_len = (size_t)local_c8.second._M_str;
      lsplit_path(&local_70,(libtorrent *)local_c8.second._M_len,p_02);
      local_c8.first._M_len = local_70.first._M_len;
      local_c8.first._M_str = local_70.first._M_str;
      local_c8.second._M_len = local_70.second._M_len;
      local_c8.second._M_str = local_70.second._M_str;
      pcVar2 = (char *)CONCAT71((int7)((ulong)pcVar2 >> 8),local_a8.first._M_len == 0);
    } while (local_70.first._M_len != 0 || local_a8.first._M_len != 0);
  }
  return (int)uVar3;
}

Assistant:

int path_compare(string_view const lhs, string_view const lfile
		, string_view const rhs, string_view const rfile)
	{
		for (auto lhs_elems = lsplit_path(lhs), rhs_elems = lsplit_path(rhs);
			!lhs_elems.first.empty() || !rhs_elems.first.empty();
			lhs_elems = lsplit_path(lhs_elems.second), rhs_elems = lsplit_path(rhs_elems.second))
		{
			if (lhs_elems.first.empty() || rhs_elems.first.empty())
			{
				if (lhs_elems.first.empty()) lhs_elems.first = lfile;
				if (rhs_elems.first.empty()) rhs_elems.first = rfile;
				return lhs_elems.first.compare(rhs_elems.first);
			}

			int const ret = lhs_elems.first.compare(rhs_elems.first);
			if (ret != 0) return ret;
		}
		return 0;
	}